

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.h
# Opt level: O1

void __thiscall
iqxmlrpc::Http_proxy_client_connection::~Http_proxy_client_connection
          (Http_proxy_client_connection *this)

{
  Header **ppHVar1;
  size_t *this_00;
  undefined1 *puVar2;
  long *plVar3;
  
  this[-1].super_Http_client_connection.super_Client_connection.preader.total_sz =
       (size_t)&PTR__Http_client_connection_0018aa28;
  (this->super_Http_client_connection).super_Client_connection._vptr_Client_connection =
       (_func_int **)&PTR__Http_client_connection_0018aa68;
  puVar2 = (undefined1 *)
           (this->super_Http_client_connection).super_Client_connection.preader.content_cache.
           field_2._M_allocated_capacity;
  ppHVar1 = &(this->super_Http_client_connection).super_Client_connection.preader.header;
  if ((Header **)puVar2 != ppHVar1) {
    operator_delete(puVar2,(ulong)((long)&(*ppHVar1)->_vptr_Header + 1));
  }
  this_00 = &this[-1].super_Http_client_connection.super_Client_connection.preader.total_sz;
  plVar3 = (long *)(this->super_Http_client_connection).super_Client_connection.preader.
                   content_cache._M_string_length;
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
  }
  iqnet::Connection::~Connection((Connection *)this);
  Client_connection::~Client_connection((Client_connection *)this_00);
  operator_delete(this_00,0xf0);
  return;
}

Assistant:

class LIBIQXMLRPC_API Http_proxy_client_connection:
  public Http_client_connection
{
public:
  Http_proxy_client_connection( const iqnet::Socket& s, bool non_block ):
    Http_client_connection( s, non_block ) {}

private:
  virtual std::string decorate_uri() const;
}